

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O1

HTTP_HEADERS_HANDLE HTTPHeaders_Alloc(void)

{
  HTTP_HEADERS_HANDLE __ptr;
  MAP_HANDLE pMVar1;
  LOGGER_LOG p_Var2;
  
  __ptr = (HTTP_HEADERS_HANDLE)malloc(8);
  if (__ptr == (HTTP_HEADERS_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpheaders.c"
                ,"HTTPHeaders_Alloc",0x1d,1,"malloc failed");
      return (HTTP_HEADERS_HANDLE)0x0;
    }
  }
  else {
    pMVar1 = Map_Create((MAP_FILTER_CALLBACK)0x0);
    __ptr->headers = pMVar1;
    if (pMVar1 != (MAP_HANDLE)0x0) {
      return __ptr;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpheaders.c"
                ,"HTTPHeaders_Alloc",0x25,1,"Map_Create failed");
    }
    free(__ptr);
  }
  return (HTTP_HEADERS_HANDLE)0x0;
}

Assistant:

HTTP_HEADERS_HANDLE HTTPHeaders_Alloc(void)
{
    /*Codes_SRS_HTTP_HEADERS_99_002:[ This API shall produce a HTTP_HANDLE that can later be used in subsequent calls to the module.]*/
    HTTP_HEADERS_HANDLE_DATA* result;
    result = (HTTP_HEADERS_HANDLE_DATA*)malloc(sizeof(HTTP_HEADERS_HANDLE_DATA));

    if (result == NULL)
    {
        LogError("malloc failed");
    }
    else
    {
        /*Codes_SRS_HTTP_HEADERS_99_004:[ After a successful init, HTTPHeaders_GetHeaderCount shall report 0 existing headers.]*/
        result->headers = Map_Create(NULL);
        if (result->headers == NULL)
        {
            LogError("Map_Create failed");
            free(result);
            result = NULL;
        }
        else
        {
            /*all is fine*/
        }
    }

    /*Codes_SRS_HTTP_HEADERS_99_003:[ The function shall return NULL when the function cannot execute properly]*/
    return (HTTP_HEADERS_HANDLE)result;
}